

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddAllocatedSlowWithCopy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this,
          Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value,
          Arena *value_arena,Arena *my_arena)

{
  LogMessageFatal local_20;
  
  if (value_arena == (Arena *)0x0 && my_arena != (Arena *)0x0) {
    if (value != (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)0x0) {
      ThreadSafeArena::AddCleanup(&my_arena->impl_,value,arena_delete_object<std::__cxx11::string>);
    }
  }
  else if (my_arena != value_arena) {
    if (value_arena == (Arena *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x21d,"value_arena != nullptr");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
    }
    value = CloneSlow(my_arena,value);
  }
  UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (this,value);
  return;
}

Assistant:

PROTOBUF_NOINLINE void AddAllocatedSlowWithCopy(
      // Pass value_arena and my_arena to avoid duplicate virtual call (value)
      // or load (mine).
      Value<TypeHandler>* value, Arena* value_arena, Arena* my_arena) {
    using H = CommonHandler<TypeHandler>;
    // Ensure that either the value is in the same arena, or if not, we do the
    // appropriate thing: Own() it (if it's on heap and we're in an arena) or
    // copy it to our arena/heap (otherwise).
    if (my_arena != nullptr && value_arena == nullptr) {
      my_arena->Own(value);
    } else if (my_arena != value_arena) {
      ABSL_DCHECK(value_arena != nullptr);
      value = cast<TypeHandler>(CloneSlow(my_arena, *value));
    }

    UnsafeArenaAddAllocated<H>(value);
  }